

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.c
# Opt level: O2

_Bool upb_inttable_insert(upb_inttable *t,uintptr_t key,upb_value val,upb_Arena *a)

{
  byte *pbVar1;
  uint32_t uVar2;
  uint8_t *puVar3;
  upb_tabent *puVar4;
  upb_key tabkey;
  int iVar5;
  size_t i;
  undefined8 extraout_RDX;
  undefined8 uVar6;
  undefined8 extraout_RDX_00;
  lookupkey_t key_00;
  lookupkey_t key_01;
  upb_table new_table;
  
  if (key < t->array_size) {
    puVar3 = t->presence_mask;
    if ((puVar3[key >> 3] >> ((uint)key & 7) & 1) != 0) {
      __assert_fail("!upb_inttable_arrhas(t, key)",
                    "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/hash/common.c"
                    ,0x2cf,
                    "_Bool upb_inttable_insert(upb_inttable *, uintptr_t, upb_value, upb_Arena *)");
    }
    t->array_count = t->array_count + 1;
    t->array[key].val = val.val;
    pbVar1 = puVar3 + (key >> 3);
    *pbVar1 = *pbVar1 | '\x01' << ((byte)key & 7);
  }
  else {
    uVar2 = (t->t).mask;
    if ((t->t).count == (uVar2 - (uVar2 + 1 >> 3)) + 1) {
      iVar5 = init((EVP_PKEY_CTX *)&new_table);
      if ((char)iVar5 == '\0') {
        return false;
      }
      i = begin(&t->t);
      uVar6 = extraout_RDX;
      while (i < (t->t).mask + 1) {
        puVar4 = (t->t).entries;
        tabkey = (upb_key)puVar4[i].key.num;
        key_00.str.size = uVar6;
        key_00.num = tabkey.num;
        insert(&new_table,key_00,tabkey,(upb_value)puVar4[i].val.val,
               (uint)((ulong)tabkey >> 0x20) ^ (uint)tabkey.num,inthash,inteql);
        i = next(&t->t,i);
        uVar6 = extraout_RDX_00;
      }
      if ((t->t).count != new_table.count) {
        __assert_fail("t->t.count == new_table.count",
                      "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/hash/common.c"
                      ,0x2e3,
                      "_Bool upb_inttable_insert(upb_inttable *, uintptr_t, upb_value, upb_Arena *)"
                     );
      }
      (t->t).entries = new_table.entries;
      (t->t).count = new_table.count;
      (t->t).mask = new_table.mask;
    }
    key_01.str.size = (size_t)inthash;
    key_01.num = key;
    insert(&t->t,key_01,(upb_key)key,val,(uint)(key >> 0x20) ^ (uint)key,inthash,inteql);
  }
  return true;
}

Assistant:

bool upb_inttable_insert(upb_inttable* t, uintptr_t key, upb_value val,
                         upb_Arena* a) {
  if (key < t->array_size) {
    UPB_ASSERT(!upb_inttable_arrhas(t, key));
    t->array_count++;
    mutable_array(t)[key] = val;
    ((uint8_t*)t->presence_mask)[key / 8] |= (1 << (key % 8));
  } else {
    if (isfull(&t->t)) {
      /* Need to resize the hash part, but we re-use the array part. */
      size_t i;
      upb_table new_table;

      if (!init(&new_table, _upb_log2_table_size(&t->t) + 1, a)) {
        return false;
      }

      for (i = begin(&t->t); i < upb_table_size(&t->t); i = next(&t->t, i)) {
        const upb_tabent* e = &t->t.entries[i];
        insert(&new_table, intkey(e->key.num), e->key, e->val, inthash(e->key),
               &inthash, &inteql);
      }

      UPB_ASSERT(t->t.count == new_table.count);

      t->t = new_table;
    }
    upb_key tabkey = {.num = key};
    insert(&t->t, intkey(key), tabkey, val, upb_inthash(key), &inthash,
           &inteql);
  }
  check(t);
  return true;
}